

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

IVec4 __thiscall
tcu::ConstPixelBufferAccess::getPixelInt(ConstPixelBufferAccess *this,int x,int y,int z)

{
  undefined2 uVar1;
  Channel CVar2;
  ushort uVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  ChannelOrder CVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  TextureSwizzle *pTVar10;
  ChannelType CVar11;
  ChannelOrder CVar12;
  ulong uVar13;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  Vector<int,_4> *res;
  ChannelOrder CVar14;
  undefined4 in_register_00000034;
  ChannelOrder *pCVar15;
  ChannelOrder CVar16;
  int in_R8D;
  int c;
  long lVar17;
  ChannelOrder *pCVar18;
  TextureFormat TVar19;
  IVec4 IVar20;
  IVec4 result;
  undefined1 local_48 [16];
  
  pCVar15 = (ChannelOrder *)CONCAT44(in_register_00000034,x);
  uVar13 = (ulong)(y * pCVar15[5]);
  pCVar18 = (ChannelOrder *)
            ((long)(int)(in_R8D * pCVar15[7]) + (long)(int)(z * pCVar15[6]) +
            (long)(int)(y * pCVar15[5]) + *(undefined8 *)(pCVar15 + 8));
  local_48 = (undefined1  [16])0x0;
  CVar14 = pCVar15[1];
  switch(CVar14) {
  case L:
    CVar6 = *pCVar15;
    switch(CVar6) {
    case RGB:
    case sRGB:
      CVar14 = (ChannelOrder)*(byte *)((long)pCVar18 + 2);
      TVar19.order = (uint)(ushort)((short)*pCVar18 & 0xff);
      TVar19.type._0_1_ = (char)((ushort)(short)*pCVar18 >> 8);
      TVar19.type._1_3_ = 0;
      this->m_format = TVar19;
      break;
    case RGBA:
    case sRGBA:
      CVar14 = *pCVar18;
      auVar4[0xc] = (char)(CVar14 >> 0x18);
      auVar4._0_12_ = ZEXT712(0);
      auVar5[1] = 0;
      auVar5[0] = (byte)(CVar14 >> 0x10);
      auVar5._2_3_ = auVar4._10_3_;
      auVar5._5_8_ = 0;
      local_48[5] = 0;
      local_48[4] = (byte)(CVar14 >> 8);
      local_48._6_7_ = SUB137(auVar5 << 0x40,6);
      local_48._0_4_ = CVar14 & 0xff;
      local_48._13_3_ = 0;
      goto LAB_019a1f5a;
    default:
      goto switchD_019a1eca_caseD_9;
    }
    goto LAB_019a1e88;
  default:
    CVar6 = *pCVar15;
switchD_019a1eca_caseD_9:
    pTVar10 = getChannelReadSwizzle(CVar6);
    iVar8 = getChannelSize(CVar14);
    lVar17 = 0;
    uVar13 = extraout_RDX;
    do {
      CVar2 = pTVar10->components[lVar17];
      if (CVar2 < CHANNEL_ZERO) {
        iVar9 = anon_unknown_74::channelToInt
                          ((byte *)((long)(int)(CVar2 * iVar8) + (long)pCVar18),pCVar15[1]);
        uVar13 = extraout_RDX_00;
LAB_019a1f1f:
        *(int *)(local_48 + lVar17 * 4) = iVar9;
      }
      else {
        iVar9 = 0;
        if (CVar2 == CHANNEL_ZERO) goto LAB_019a1f1f;
        if (CVar2 == CHANNEL_ONE) {
          iVar9 = 1;
          goto LAB_019a1f1f;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
LAB_019a1f5a:
    (this->m_format).order = (int)local_48._0_8_;
    (this->m_format).type = (int)((ulong)local_48._0_8_ >> 0x20);
    (this->m_size).m_data[0] = local_48._8_4_;
    (this->m_size).m_data[1] = local_48._12_4_;
    break;
  case RGB:
  case sBGR:
    CVar14 = *pCVar18;
    (this->m_format).order = (uint)((byte)(char)CVar14 >> 4);
    (this->m_format).type = (byte)(char)CVar14 & UNORM_INT_1010102_REV;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 1;
    break;
  case RGBA:
  case sBGRA:
    uVar1 = (undefined2)*pCVar18;
    CVar6 = (ChannelOrder)((ushort)uVar1 >> 0xb);
    CVar11 = (ushort)uVar1 >> 5 & (UNSIGNED_INT24|UNSIGNED_INT16);
    goto LAB_019a1e7a;
  case ARGB:
    uVar1 = (undefined2)*pCVar18;
    CVar6 = (ushort)uVar1 >> 10 & (sBGR|sRGBA);
    CVar11 = (ushort)uVar1 >> 5 & UNSIGNED_INT16;
LAB_019a1e7a:
    uVar13 = (ulong)CVar11;
    CVar14 = (ushort)uVar1 & (sBGR|sRGBA);
    if (*pCVar15 == RGB) {
LAB_019a1e83:
      (this->m_format).order = CVar6;
      (this->m_format).type = (ChannelType)uVar13;
LAB_019a1e88:
      (this->m_size).m_data[0] = CVar14;
    }
    else {
      (this->m_format).order = CVar14;
      (this->m_format).type = CVar11;
      (this->m_size).m_data[0] = CVar6;
    }
    (this->m_size).m_data[1] = 1;
    break;
  case BGR:
  case D:
    uVar1 = (undefined2)*pCVar18;
    uVar3 = (ushort)uVar1 >> 0xc;
    CVar11 = (ushort)uVar1 >> 8 & UNORM_INT_1010102_REV;
    CVar14 = (ushort)uVar1 >> 4 & sRGBA;
    uVar7 = (ushort)uVar1 & 0xf;
    goto LAB_019a1dfc;
  case BGRA:
  case S:
    uVar1 = (undefined2)*pCVar18;
    uVar3 = (ushort)uVar1 >> 0xb;
    CVar11 = (ushort)uVar1 >> 6 & UNSIGNED_INT16;
    CVar14 = (ushort)uVar1 >> 1 & (sBGR|sRGBA);
    uVar7 = (ushort)uVar1 & 1;
LAB_019a1dfc:
    uVar13 = (ulong)CVar11;
    if (*pCVar15 == RGBA) {
      (this->m_format).order = (uint)uVar3;
      (this->m_format).type = CVar11;
      (this->m_size).m_data[0] = CVar14;
    }
    else {
      (this->m_format).order = CVar14;
      (this->m_format).type = CVar11;
      (this->m_size).m_data[0] = (uint)uVar3;
    }
LAB_019a1e14:
    (this->m_size).m_data[1] = uVar7;
    break;
  case sR:
    uVar1 = (undefined2)*pCVar18;
    CVar14 = (ushort)uVar1 >> 10 & (sBGR|sRGBA);
    uVar13 = (ulong)CVar14;
    (this->m_format).order = CVar14;
    (this->m_format).type = (ushort)uVar1 >> 5 & UNSIGNED_INT16;
    (this->m_size).m_data[0] = (ushort)uVar1 & 0x1f;
    (this->m_size).m_data[1] = (uint)((ushort)uVar1 >> 0xf);
    break;
  case sRG:
    CVar14 = *pCVar18;
    CVar6 = CVar14 >> 0x16;
    uVar13 = (ulong)(CVar14 >> 0xc & 0x3ff);
    CVar14 = CVar14 >> 2 & 0x3ff;
    goto LAB_019a1e83;
  case sRGB:
  case DS:
    CVar14 = *pCVar18;
    CVar6 = -(CVar14 & 0x200) | CVar14 & 0x3ff;
    CVar11 = -(CVar14 >> 10 & 0x200) | CVar14 >> 10 & 0x3ff;
    uVar13 = (ulong)CVar11;
    CVar12 = -(CVar14 >> 0x14 & 0x200) | CVar14 >> 0x14 & 0x3ff;
    if (*pCVar15 == RGBA) {
      (this->m_format).order = CVar6;
      (this->m_format).type = CVar11;
      (this->m_size).m_data[0] = CVar12;
    }
    else {
      (this->m_format).order = CVar12;
      (this->m_format).type = CVar11;
      (this->m_size).m_data[0] = CVar6;
    }
    (this->m_size).m_data[1] = -(CVar14 >> 0x1e & 0xfffffffe) | CVar14 >> 0x1e;
    break;
  case sRGBA:
  case CHANNELORDER_LAST:
    CVar14 = *pCVar18;
    CVar12 = CVar14 & 0x3ff;
    uVar13 = (ulong)CVar12;
    CVar16 = CVar14 >> 0x14 & 0x3ff;
    uVar7 = CVar14 >> 0x1e;
    CVar6 = CVar16;
    if (*pCVar15 != RGBA) {
      CVar6 = CVar12;
      CVar12 = CVar16;
    }
    (this->m_format).order = CVar12;
    (this->m_format).type = CVar14 >> 10 & 0x3ff;
    (this->m_size).m_data[0] = CVar6;
    goto LAB_019a1e14;
  }
  IVar20.m_data[2] = (int)uVar13;
  IVar20.m_data[3] = (int)(uVar13 >> 0x20);
  IVar20.m_data._0_8_ = this;
  return (IVec4)IVar20.m_data;
}

Assistant:

IVec4 ConstPixelBufferAccess::getPixelInt (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, m_size.x()));
	DE_ASSERT(de::inBounds(y, 0, m_size.y()));
	DE_ASSERT(de::inBounds(z, 0, m_size.z()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	const deUint8* const	pixelPtr = (const deUint8*)getPixelPtr(x, y, z);
	IVec4					result;

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
			return readRGBA8888Int(pixelPtr);
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
			return readRGB888Int(pixelPtr);
	}

#define U8(OFFS, COUNT)			((*((const deUint8* )pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define U16(OFFS, COUNT)		((*((const deUint16*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define U32(OFFS, COUNT)		((*((const deUint32*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define S32(OFFS, COUNT)		signExtend(U32(OFFS, COUNT), (COUNT))

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_BYTE_44:			// Fall-through
		case TextureFormat::UNORM_BYTE_44:				return			 UVec4(U8 ( 4,  4), U8 ( 0,  4), 0u, 1u).cast<int>();
		case TextureFormat::UNSIGNED_SHORT_565:			// Fall-through
		case TextureFormat::UNORM_SHORT_565:			return swizzleRB(UVec4(U16(11,  5), U16( 5,  6), U16( 0,  5), 1).cast<int>(), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNORM_SHORT_555:			return swizzleRB(UVec4(U16(10,  5), U16( 5,  5), U16( 0,  5), 1).cast<int>(), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNSIGNED_SHORT_4444:		// Fall-through
		case TextureFormat::UNORM_SHORT_4444:			return swizzleRB(UVec4(U16(12,  4), U16( 8,  4), U16( 4,  4), U16( 0, 4)).cast<int>(), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_5551:		// Fall-through
		case TextureFormat::UNORM_SHORT_5551:			return swizzleRB(UVec4(U16(11,  5), U16( 6,  5), U16( 1,  5), U16( 0, 1)).cast<int>(), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNORM_INT_101010:			return			 UVec4(U32(22, 10), U32(12, 10), U32( 2, 10), 1).cast<int>();
		case TextureFormat::UNORM_INT_1010102_REV:		// Fall-through
		case TextureFormat::UNSIGNED_INT_1010102_REV:	return swizzleRB(UVec4(U32( 0, 10), U32(10, 10), U32(20, 10), U32(30, 2)), m_format.order, TextureFormat::RGBA).cast<int>();
		case TextureFormat::SNORM_INT_1010102_REV:		// Fall-through
		case TextureFormat::SIGNED_INT_1010102_REV:		return swizzleRB(IVec4(S32( 0, 10), S32(10, 10), S32(20, 10), S32(30, 2)), m_format.order, TextureFormat::RGBA);

		case TextureFormat::UNORM_SHORT_1555:
			DE_ASSERT(m_format.order == TextureFormat::ARGB);
			return UVec4(U16(15, 1), U16(10, 5), U16(5, 5), U16(0, 5)).cast<int>().swizzle(1,2,3,0); // ARGB -> RGBA

		default:
			break; // To generic path.
	}

#undef U8
#undef U16
#undef U32
#undef S32

	// Generic path.
	const TextureSwizzle::Channel*	channelMap	= getChannelReadSwizzle(m_format.order).components;
	int								channelSize	= getChannelSize(m_format.type);

	for (int c = 0; c < 4; c++)
	{
		switch (channelMap[c])
		{
			case TextureSwizzle::CHANNEL_0:
			case TextureSwizzle::CHANNEL_1:
			case TextureSwizzle::CHANNEL_2:
			case TextureSwizzle::CHANNEL_3:
				result[c] = channelToInt(pixelPtr + channelSize*((int)channelMap[c]), m_format.type);
				break;

			case TextureSwizzle::CHANNEL_ZERO:
				result[c] = 0;
				break;

			case TextureSwizzle::CHANNEL_ONE:
				result[c] = 1;
				break;

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}